

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O3

void __thiscall lsim::SimCircuit::write_output_pins(SimCircuit *this,uint32_t comp_id,uint64_t data)

{
  SimComponent *this_00;
  iterator iVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint32_t local_1c;
  
  local_1c = comp_id;
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_lsim::SimComponent_*>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_components)._M_h,&local_1c);
  if ((iVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>.
       _M_cur != (__node_type *)0x0) &&
     (this_00 = *(SimComponent **)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>
                        ._M_cur + 0x10), this_00 != (SimComponent *)0x0)) {
    uVar2 = this_00->m_output_start;
    if (this_00->m_control_start != uVar2) {
      uVar3 = 0;
      do {
        SimComponent::set_user_value
                  (this_00,uVar2 + (int)uVar3,(uint)((data >> (uVar3 & 0x3f) & 1) != 0));
        uVar2 = this_00->m_output_start;
        uVar3 = uVar3 + 1;
      } while ((uint)uVar3 < this_00->m_control_start - uVar2);
    }
    return;
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0xa0,"void lsim::SimCircuit::write_output_pins(uint32_t, uint64_t)");
}

Assistant:

void SimCircuit::write_output_pins(uint32_t comp_id, uint64_t data) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    for (auto idx = 0u; idx < comp->num_outputs(); ++idx) {
        comp->set_user_value(comp->output_pin_index(idx), static_cast<Value>((data >> idx) & 1));
    }
}